

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Preferences.cpp
# Opt level: O1

void __thiscall f8n::prefs::Preferences::SetString(Preferences *this,char *key,char *value)

{
  allocator<char> local_39;
  long *local_38 [2];
  long local_28 [2];
  
  std::__cxx11::string::string<std::allocator<char>>((string *)local_38,key,&local_39);
  (*(this->super_IPreferences)._vptr_IPreferences[0x11])(this,(string *)local_38,value);
  if (local_38[0] != local_28) {
    operator_delete(local_38[0],local_28[0] + 1);
  }
  return;
}

Assistant:

void Preferences::SetString(const char* key, const char* value) {
    this->SetString(std::string(key), value);
}